

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::source_import(context_t *context,string *path)

{
  proxy *in_RDI;
  string *in_stack_00000100;
  instance_type *in_stack_00000108;
  proxy *ns;
  
  ns = in_RDI;
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x43b3b9);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x43b3c5);
  cs::instance_type::source_import(in_stack_00000108,in_stack_00000100);
  cs::make_namespace((namespace_t *)ns);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x43b3f3);
  return (var)in_RDI;
}

Assistant:

var source_import(const context_t &context, const string &path)
		{
			try {
				return make_namespace(context->instance->source_import(path));
			}
			catch (...) {
				return null_pointer;
			}
		}